

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O2

void __thiscall cmTryRunCommand::RunExecutable(cmTryRunCommand *this,string *runArgs,string *out)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  char *extraout_RDX;
  char *path;
  char *extraout_RDX_00;
  pointer pbVar3;
  allocator local_47d;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string finalCommand;
  string emulator;
  char retChar [1000];
  
  retVal = -1;
  finalCommand._M_dataplus._M_p = (pointer)&finalCommand.field_2;
  finalCommand._M_string_length = 0;
  finalCommand.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
  std::__cxx11::string::string
            ((string *)retChar,"CMAKE_CROSSCOMPILING_EMULATOR",(allocator *)&emulatorWithArgs);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,(string *)retChar);
  std::__cxx11::string::string((string *)&emulator,pcVar2,&local_47d);
  std::__cxx11::string::~string((string *)retChar);
  pcVar2 = extraout_RDX;
  if (emulator._M_string_length != 0) {
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    emulatorWithArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::ExpandListArgument(&emulator,&emulatorWithArgs,false);
    cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
              ((string *)retChar,
               (cmSystemTools *)
               ((emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,path);
    std::__cxx11::string::append((string *)&finalCommand);
    std::__cxx11::string::~string((string *)retChar);
    std::__cxx11::string::append((char *)&finalCommand);
    pbVar3 = emulatorWithArgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar3 = pbVar3 + 1,
          pbVar3 != emulatorWithArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&finalCommand);
      std::__cxx11::string::append((string *)&finalCommand);
      std::__cxx11::string::append((char *)&finalCommand);
      std::__cxx11::string::append((char *)&finalCommand);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&emulatorWithArgs);
    pcVar2 = extraout_RDX_00;
  }
  cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
            ((string *)retChar,
             (cmSystemTools *)(this->super_cmCoreTryCompile).OutputFile._M_dataplus._M_p,pcVar2);
  std::__cxx11::string::append((string *)&finalCommand);
  std::__cxx11::string::~string((string *)retChar);
  if (runArgs->_M_string_length != 0) {
    std::__cxx11::string::append((string *)&finalCommand);
  }
  bVar1 = cmSystemTools::RunSingleCommand
                    (finalCommand._M_dataplus._M_p,out,out,&retVal,(char *)0x0,OUTPUT_NONE,0.0);
  if (bVar1) {
    sprintf(retChar,"%i",(ulong)(uint)retVal);
  }
  else {
    builtin_strncpy(retChar + 8,"O_RUN",6);
    builtin_strncpy(retChar,"FAILED_T",8);
  }
  cmMakefile::AddCacheDefinition
            ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&this->RunResultVariable,
             retChar,"Result of TRY_RUN",INTERNAL,false);
  std::__cxx11::string::~string((string *)&emulator);
  std::__cxx11::string::~string((string *)&finalCommand);
  return;
}

Assistant:

void cmTryRunCommand::RunExecutable(const std::string& runArgs,
                                    std::string* out)
{
  int retVal = -1;

  std::string finalCommand;
  const std::string emulator =
  this->Makefile->GetSafeDefinition("CMAKE_CROSSCOMPILING_EMULATOR");
  if (!emulator.empty())
    {
    std::vector<std::string> emulatorWithArgs;
    cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
    finalCommand += cmSystemTools::ConvertToRunCommandPath(
                                 emulatorWithArgs[0].c_str());
    finalCommand += " ";
    for (std::vector<std::string>::const_iterator ei =
         emulatorWithArgs.begin()+1;
         ei != emulatorWithArgs.end(); ++ei)
      {
      finalCommand += "\"";
      finalCommand += *ei;
      finalCommand += "\"";
      finalCommand += " ";
      }
    }
  finalCommand += cmSystemTools::ConvertToRunCommandPath(
                               this->OutputFile.c_str());
  if (!runArgs.empty())
    {
    finalCommand += runArgs;
    }
  int timeout = 0;
  bool worked = cmSystemTools::RunSingleCommand(finalCommand.c_str(),
                out, out, &retVal,
                0, cmSystemTools::OUTPUT_NONE, timeout);
  // set the run var
  char retChar[1000];
  if (worked)
    {
    sprintf(retChar, "%i", retVal);
    }
  else
    {
    strcpy(retChar, "FAILED_TO_RUN");
    }
  this->Makefile->AddCacheDefinition(this->RunResultVariable, retChar,
                                     "Result of TRY_RUN",
                                     cmState::INTERNAL);
}